

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

iterator __thiscall
QMultiMap<std::_List_iterator<Item>,_Lookback>::insert
          (QMultiMap<std::_List_iterator<Item>,_Lookback> *this,_List_iterator<Item> *key,
          Lookback *value)

{
  bool bVar1;
  QMapData<std::multimap<std::_List_iterator<Item>,_Lookback,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_Lookback>_>_>_>
  *pQVar2;
  Lookback *in_RDX;
  _List_iterator<Item> *in_RSI;
  const_iterator in_RDI;
  long in_FS_OFFSET;
  iterator i;
  QMultiMap<std::_List_iterator<Item>,_Lookback> copy;
  iterator in_stack_ffffffffffffff78;
  QMultiMap<std::_List_iterator<Item>,_Lookback> *in_stack_ffffffffffffff80;
  Map *this_00;
  pair<const_std::_List_iterator<Item>,_Lookback> local_40;
  _Rb_tree_const_iterator<std::pair<const_std::_List_iterator<Item>,_Lookback>_> local_28;
  iterator local_20;
  undefined8 local_18;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::multimap<std::_List_iterator<Item>,_Lookback,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_Lookback>_>_>_>_>
          ::isShared(&in_stack_ffffffffffffff80->d);
  if (bVar1) {
    QMultiMap(in_stack_ffffffffffffff80,
              (QMultiMap<std::_List_iterator<Item>,_Lookback> *)in_stack_ffffffffffffff78._M_node);
  }
  else {
    memset(&local_18,0,8);
    QMultiMap((QMultiMap<std::_List_iterator<Item>,_Lookback> *)0x123dd8);
  }
  detach(in_stack_ffffffffffffff80);
  local_20._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<std::_List_iterator<Item>,_Lookback,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_Lookback>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::multimap<std::_List_iterator<Item>,_Lookback,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_Lookback>_>_>_>_>
                *)0x123dfb);
  local_20._M_node =
       (_Base_ptr)
       std::
       multimap<std::_List_iterator<Item>,_Lookback,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_Lookback>_>_>
       ::lower_bound(in_stack_ffffffffffffff78._M_node,(key_type *)0x123e0c);
  pQVar2 = QtPrivate::
           QExplicitlySharedDataPointerV2<QMapData<std::multimap<std::_List_iterator<Item>,_Lookback,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_Lookback>_>_>_>_>
           ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::multimap<std::_List_iterator<Item>,_Lookback,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_Lookback>_>_>_>_>
                         *)0x123e1b);
  this_00 = &pQVar2->m;
  std::_Rb_tree_const_iterator<std::pair<const_std::_List_iterator<Item>,_Lookback>_>::
  _Rb_tree_const_iterator(&local_28,&local_20);
  std::pair<const_std::_List_iterator<Item>,_Lookback>::
  pair<const_std::_List_iterator<Item>,_Lookback,_true>(&local_40,in_RSI,in_RDX);
  std::
  multimap<std::_List_iterator<Item>,_Lookback,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_Lookback>_>_>
  ::insert(this_00,in_RDI,(value_type *)in_stack_ffffffffffffff78._M_node);
  iterator::iterator((iterator *)0x123e74,in_stack_ffffffffffffff78);
  ~QMultiMap((QMultiMap<std::_List_iterator<Item>,_Lookback> *)0x123e7e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)(iterator)local_10._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(const Key &key, const T &value)
    {
        const auto copy = d.isShared() ? *this : QMultiMap(); // keep `key`/`value` alive across the detach
        detach();
        // note that std::multimap inserts at the end of an equal_range for a key,
        // QMultiMap at the beginning.
        auto i = d->m.lower_bound(key);
        return iterator(d->m.insert(i, {key, value}));
    }